

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_chvalid(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing chvalid : 9 of 9 functions ...\n");
  }
  iVar1 = test_xmlCharInRange();
  iVar2 = test_xmlIsBaseChar();
  iVar3 = test_xmlIsBlank();
  iVar4 = test_xmlIsChar();
  iVar5 = test_xmlIsCombining();
  iVar6 = test_xmlIsDigit();
  iVar7 = test_xmlIsExtender();
  iVar8 = test_xmlIsIdeographic();
  iVar9 = test_xmlIsPubidChar();
  uVar10 = iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + iVar1;
  if (uVar10 != 0) {
    printf("Module chvalid: %d errors\n",(ulong)uVar10);
  }
  return uVar10;
}

Assistant:

static int
test_chvalid(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing chvalid : 9 of 9 functions ...\n");
    test_ret += test_xmlCharInRange();
    test_ret += test_xmlIsBaseChar();
    test_ret += test_xmlIsBlank();
    test_ret += test_xmlIsChar();
    test_ret += test_xmlIsCombining();
    test_ret += test_xmlIsDigit();
    test_ret += test_xmlIsExtender();
    test_ret += test_xmlIsIdeographic();
    test_ret += test_xmlIsPubidChar();

    if (test_ret != 0)
	printf("Module chvalid: %d errors\n", test_ret);
    return(test_ret);
}